

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool __thiscall
cmDependsFortran::WriteDependenciesReal
          (cmDependsFortran *this,string *obj,cmFortranSourceInfo *info,string *mod_dir,
          string *stamp_dir,ostream *makeDepends,ostream *internalDepends,bool buildingIntrinsics)

{
  _Rb_tree_node_base *__k;
  _Base_ptr __v;
  char cVar1;
  cmMakefile *this_00;
  bool bVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  const_iterator cVar5;
  iterator iVar6;
  cmValue cVar7;
  _Base_ptr p_Var8;
  cmOutputConverter *this_01;
  string_view source;
  string_view source_00;
  allocator<char> local_189;
  cmGlobalGenerator *local_188;
  _Base_ptr local_180;
  string stampFile;
  string stampFileForMake;
  string driver;
  string obj_m;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  req;
  string stampFile_1;
  string obj_i;
  string local_50;
  
  cmOutputConverter::MaybeRelativeToTopBinDir
            (&obj_i,&(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                     super_cmLocalGenerator.super_cmOutputConverter,obj);
  cmSystemTools::ConvertToOutputPath(&obj_m,&obj_i);
  poVar3 = std::operator<<(internalDepends,(string *)&obj_i);
  poVar3 = std::operator<<(poVar3,"\n ");
  poVar3 = std::operator<<(poVar3,(string *)info);
  std::operator<<(poVar3,'\n');
  if ((info->Includes)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_188 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                super_cmLocalGenerator.GlobalGenerator;
    cVar1 = *(char *)((long)&local_188[1].FindMakeProgramFile._M_string_length + 4);
    local_180 = (_Base_ptr)CONCAT71(local_180._1_7_,cVar1);
    if (cVar1 == '\x01') {
      poVar3 = std::operator<<(makeDepends,(string *)&obj_m);
      std::operator<<(poVar3,':');
    }
    local_188 = (cmGlobalGenerator *)&local_188[1].MakeSilentFlag.field_2;
    for (p_Var4 = (info->Includes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(info->Includes)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      cmOutputConverter::MaybeRelativeToTopBinDir
                (&stampFile,
                 &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                  super_cmLocalGenerator.super_cmOutputConverter,(string *)(p_Var4 + 1));
      cmSystemTools::ConvertToOutputPath((string *)&req,&stampFile);
      std::__cxx11::string::~string((string *)&stampFile);
      if ((char)local_180 == '\0') {
        poVar3 = std::operator<<(makeDepends,(string *)&obj_m);
        poVar3 = std::operator<<(poVar3,": ");
        poVar3 = std::operator<<(poVar3,(string *)&req);
        std::operator<<(poVar3,'\n');
      }
      else {
        poVar3 = std::operator<<(makeDepends,' ');
        poVar3 = std::operator<<(poVar3,(string *)local_188);
        poVar3 = std::operator<<(poVar3,' ');
        std::operator<<(poVar3,(string *)&req);
      }
      poVar3 = std::operator<<(internalDepends,' ');
      poVar3 = std::operator<<(poVar3,(string *)(p_Var4 + 1));
      std::operator<<(poVar3,'\n');
      std::__cxx11::string::~string((string *)&req);
    }
    std::operator<<(makeDepends,'\n');
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&req._M_t,&(info->Requires)._M_t);
  if (buildingIntrinsics) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&req,(info->Intrinsics)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&(info->Intrinsics)._M_t._M_impl.super__Rb_tree_header);
  }
  local_188 = (cmGlobalGenerator *)&info->Provides;
  local_180 = &(info->Provides)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var4 = req._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var4 == &req._M_t._M_impl.super__Rb_tree_header) {
      if ((info->Provides)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        p_Var8 = (info->Provides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (p_Var8 != local_180) {
          __v = p_Var8 + 1;
          local_188 = (cmGlobalGenerator *)p_Var8;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)(this->Internal)._M_t.
                        super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                        .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
          stampFile._M_string_length = (size_type)(mod_dir->_M_dataplus)._M_p;
          stampFile._M_dataplus._M_p = (pointer)mod_dir->_M_string_length;
          stampFileForMake._M_dataplus._M_p = (pointer)0x1;
          stampFileForMake._M_string_length = (size_type)&stampFileForMake.field_2;
          stampFileForMake.field_2._M_local_buf[0] = '/';
          cmStrCat<std::__cxx11::string>
                    (&driver,(cmAlphaNum *)&stampFile,(cmAlphaNum *)&stampFileForMake,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
          this_01 = &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                     super_cmLocalGenerator.super_cmOutputConverter;
          cmOutputConverter::MaybeRelativeToTopBinDir(&stampFileForMake,this_01,&driver);
          source._M_str = stampFileForMake._M_dataplus._M_p;
          source._M_len = stampFileForMake._M_string_length;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&stampFile,this_01,source,SHELL);
          std::__cxx11::string::operator=((string *)&driver,(string *)&stampFile);
          std::__cxx11::string::~string((string *)&stampFile);
          std::__cxx11::string::~string((string *)&stampFileForMake);
          stampFile._M_string_length = (size_type)(stamp_dir->_M_dataplus)._M_p;
          stampFile._M_dataplus._M_p = (pointer)stamp_dir->_M_string_length;
          stampFileForMake._M_dataplus._M_p = (pointer)0x1;
          stampFileForMake._M_string_length = (size_type)&stampFileForMake.field_2;
          stampFileForMake.field_2._M_local_buf[0] = '/';
          cmStrCat<std::__cxx11::string,char[7]>
                    (&stampFile_1,(cmAlphaNum *)&stampFile,(cmAlphaNum *)&stampFileForMake,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v,
                     (char (*) [7])".stamp");
          cmOutputConverter::MaybeRelativeToTopBinDir
                    (&stampFile,
                     &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                      super_cmLocalGenerator.super_cmOutputConverter,&stampFile_1);
          std::__cxx11::string::operator=((string *)&stampFile_1,(string *)&stampFile);
          std::__cxx11::string::~string((string *)&stampFile);
          source_00._M_str = stampFile_1._M_dataplus._M_p;
          source_00._M_len = stampFile_1._M_string_length;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&stampFile,
                     &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                      super_cmLocalGenerator.super_cmOutputConverter,source_00,SHELL);
          cmSystemTools::ConvertToOutputPath(&stampFileForMake,&stampFile_1);
          poVar3 = std::operator<<(makeDepends,(string *)&obj_m);
          poVar3 = std::operator<<(poVar3,".provides.build");
          poVar3 = std::operator<<(poVar3,": ");
          poVar3 = std::operator<<(poVar3,(string *)&stampFileForMake);
          std::operator<<(poVar3,'\n');
          poVar3 = std::operator<<(makeDepends,(string *)&stampFileForMake);
          poVar3 = std::operator<<(poVar3,": ");
          poVar3 = std::operator<<(poVar3,(string *)&obj_m);
          std::operator<<(poVar3,'\n');
          poVar3 = std::operator<<(makeDepends,"\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod ");
          poVar3 = std::operator<<(poVar3,(string *)&driver);
          poVar3 = std::operator<<(poVar3,' ');
          std::operator<<(poVar3,(string *)&stampFile);
          this_00 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                    super_cmLocalGenerator.Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"CMAKE_Fortran_COMPILER_ID",&local_189);
          cVar7 = cmMakefile::GetDefinition(this_00,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
            poVar3 = std::operator<<(makeDepends,' ');
            std::operator<<(poVar3,(string *)cVar7.Value);
          }
          std::operator<<(makeDepends,'\n');
          std::__cxx11::string::~string((string *)&stampFileForMake);
          std::__cxx11::string::~string((string *)&stampFile);
          std::__cxx11::string::~string((string *)&stampFile_1);
          std::__cxx11::string::~string((string *)&driver);
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)local_188);
        }
        poVar3 = std::operator<<(makeDepends,(string *)&obj_m);
        std::operator<<(poVar3,".provides.build:\n");
        poVar3 = std::operator<<(makeDepends,"\t$(CMAKE_COMMAND) -E touch ");
        poVar3 = std::operator<<(poVar3,(string *)&obj_m);
        std::operator<<(poVar3,".provides.build\n");
        stampFile._M_string_length =
             (size_type)(this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
        stampFile._M_dataplus._M_p =
             (pointer)(this->super_cmDepends).TargetDirectory._M_string_length;
        stampFileForMake._M_dataplus._M_p = &DAT_00000006;
        stampFileForMake._M_string_length = (size_type)anon_var_dwarf_137a1dd;
        cmStrCat<>(&driver,(cmAlphaNum *)&stampFile,(cmAlphaNum *)&stampFileForMake);
        cmOutputConverter::MaybeRelativeToTopBinDir
                  (&stampFileForMake,
                   &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                    super_cmLocalGenerator.super_cmOutputConverter,&driver);
        cmSystemTools::ConvertToOutputPath(&stampFile,&stampFileForMake);
        std::__cxx11::string::operator=((string *)&driver,(string *)&stampFile);
        std::__cxx11::string::~string((string *)&stampFile);
        std::__cxx11::string::~string((string *)&stampFileForMake);
        poVar3 = std::operator<<(makeDepends,(string *)&driver);
        poVar3 = std::operator<<(poVar3,": ");
        poVar3 = std::operator<<(poVar3,(string *)&obj_m);
        std::operator<<(poVar3,".provides.build\n");
        std::__cxx11::string::~string((string *)&driver);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&req._M_t);
      std::__cxx11::string::~string((string *)&obj_m);
      std::__cxx11::string::~string((string *)&obj_i);
      return true;
    }
    __k = p_Var4 + 1;
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_188,(key_type *)__k);
    if (cVar5._M_node == local_180) {
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(((this->Internal)._M_t.
                        super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                        .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl)->
                      TargetRequires)._M_t,(key_type *)__k);
      if (iVar6._M_node ==
          (_Base_ptr)
          ((long)&(((this->Internal)._M_t.
                    super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                    .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl)->
                  TargetRequires)._M_t + 8U)) {
        abort();
      }
      if (iVar6._M_node[2]._M_parent == (_Base_ptr)0x0) {
        stampFile._M_dataplus._M_p = (pointer)&stampFile.field_2;
        stampFile._M_string_length = 0;
        stampFile.field_2._M_local_buf[0] = '\0';
        bVar2 = FindModule(this,(string *)__k,&stampFile);
        if (bVar2) {
          cmOutputConverter::MaybeRelativeToTopBinDir
                    (&driver,&(((this->super_cmDepends).LocalGenerator)->
                              super_cmLocalCommonGenerator).super_cmLocalGenerator.
                              super_cmOutputConverter,&stampFile);
          cmSystemTools::ConvertToOutputPath(&stampFileForMake,&driver);
          std::__cxx11::string::operator=((string *)&stampFile,(string *)&stampFileForMake);
          std::__cxx11::string::~string((string *)&stampFileForMake);
          std::__cxx11::string::~string((string *)&driver);
          poVar3 = std::operator<<(makeDepends,(string *)&obj_m);
          poVar3 = std::operator<<(poVar3,": ");
          poVar3 = std::operator<<(poVar3,(string *)&stampFile);
          std::operator<<(poVar3,'\n');
        }
      }
      else {
        cmOutputConverter::MaybeRelativeToTopBinDir
                  (&stampFileForMake,
                   &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                    super_cmLocalGenerator.super_cmOutputConverter,(string *)(iVar6._M_node + 2));
        cmSystemTools::ConvertToOutputPath(&stampFile,&stampFileForMake);
        std::__cxx11::string::~string((string *)&stampFileForMake);
        poVar3 = std::operator<<(makeDepends,(string *)&obj_m);
        poVar3 = std::operator<<(poVar3,": ");
        poVar3 = std::operator<<(poVar3,(string *)&stampFile);
        std::operator<<(poVar3,'\n');
      }
      std::__cxx11::string::~string((string *)&stampFile);
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

bool cmDependsFortran::WriteDependenciesReal(std::string const& obj,
                                             cmFortranSourceInfo const& info,
                                             std::string const& mod_dir,
                                             std::string const& stamp_dir,
                                             std::ostream& makeDepends,
                                             std::ostream& internalDepends,
                                             bool buildingIntrinsics)
{
  // Get the source file for this object.
  std::string const& src = info.Source;

  // Write the include dependencies to the output stream.
  std::string obj_i = this->LocalGenerator->MaybeRelativeToTopBinDir(obj);
  std::string obj_m = cmSystemTools::ConvertToOutputPath(obj_i);
  internalDepends << obj_i << "\n " << src << '\n';
  if (!info.Includes.empty()) {
    const auto& lineContinue = static_cast<cmGlobalUnixMakefileGenerator3*>(
                                 this->LocalGenerator->GetGlobalGenerator())
                                 ->LineContinueDirective;
    bool supportLongLineDepend = static_cast<cmGlobalUnixMakefileGenerator3*>(
                                   this->LocalGenerator->GetGlobalGenerator())
                                   ->SupportsLongLineDependencies();
    if (supportLongLineDepend) {
      makeDepends << obj_m << ':';
    }
    for (std::string const& i : info.Includes) {
      std::string dependee = cmSystemTools::ConvertToOutputPath(
        this->LocalGenerator->MaybeRelativeToTopBinDir(i));
      if (supportLongLineDepend) {
        makeDepends << ' ' << lineContinue << ' ' << dependee;
      } else {
        makeDepends << obj_m << ": " << dependee << '\n';
      }
      internalDepends << ' ' << i << '\n';
    }
    makeDepends << '\n';
  }

  std::set<std::string> req = info.Requires;
  if (buildingIntrinsics) {
    req.insert(info.Intrinsics.begin(), info.Intrinsics.end());
  }

  // Write module requirements to the output stream.
  for (std::string const& i : req) {
    // Require only modules not provided in the same source.
    if (info.Provides.find(i) != info.Provides.cend()) {
      continue;
    }

    // The object file should depend on timestamped files for the
    // modules it uses.
    auto required = this->Internal->TargetRequires.find(i);
    if (required == this->Internal->TargetRequires.end()) {
      abort();
    }
    if (!required->second.empty()) {
      // This module is known.  Depend on its timestamp file.
      std::string stampFile = cmSystemTools::ConvertToOutputPath(
        this->LocalGenerator->MaybeRelativeToTopBinDir(required->second));
      makeDepends << obj_m << ": " << stampFile << '\n';
    } else {
      // This module is not known to CMake.  Try to locate it where
      // the compiler will and depend on that.
      std::string module;
      if (this->FindModule(i, module)) {
        module = cmSystemTools::ConvertToOutputPath(
          this->LocalGenerator->MaybeRelativeToTopBinDir(module));
        makeDepends << obj_m << ": " << module << '\n';
      }
    }
  }

  // If any modules are provided then they must be converted to stamp files.
  if (!info.Provides.empty()) {
    // Create a target to copy the module after the object file
    // changes.
    for (std::string const& i : info.Provides) {
      // Include this module in the set provided by this target.
      this->Internal->TargetProvides.insert(i);

      // Always use lower case for the mod stamp file name.  The
      // cmake_copy_f90_mod will call back to this class, which will
      // try various cases for the real mod file name.
      std::string modFile = cmStrCat(mod_dir, '/', i);
      modFile = this->LocalGenerator->ConvertToOutputFormat(
        this->LocalGenerator->MaybeRelativeToTopBinDir(modFile),
        cmOutputConverter::SHELL);
      std::string stampFile = cmStrCat(stamp_dir, '/', i, ".stamp");
      stampFile = this->LocalGenerator->MaybeRelativeToTopBinDir(stampFile);
      std::string const stampFileForShell =
        this->LocalGenerator->ConvertToOutputFormat(stampFile,
                                                    cmOutputConverter::SHELL);
      std::string const stampFileForMake =
        cmSystemTools::ConvertToOutputPath(stampFile);

      makeDepends << obj_m << ".provides.build"
                  << ": " << stampFileForMake << '\n';
      // Note that when cmake_copy_f90_mod finds that a module file
      // and the corresponding stamp file have no differences, the stamp
      // file is not updated. In such case the stamp file will be always
      // older than its prerequisite and trigger cmake_copy_f90_mod
      // on each new build. This is expected behavior for incremental
      // builds and can not be changed without preforming recursive make
      // calls that would considerably slow down the building process.
      makeDepends << stampFileForMake << ": " << obj_m << '\n';
      makeDepends << "\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod " << modFile
                  << ' ' << stampFileForShell;
      cmMakefile* mf = this->LocalGenerator->GetMakefile();
      cmValue cid = mf->GetDefinition("CMAKE_Fortran_COMPILER_ID");
      if (cmNonempty(cid)) {
        makeDepends << ' ' << *cid;
      }
      makeDepends << '\n';
    }
    makeDepends << obj_m << ".provides.build:\n";
    // After copying the modules update the timestamp file.
    makeDepends << "\t$(CMAKE_COMMAND) -E touch " << obj_m
                << ".provides.build\n";

    // Make sure the module timestamp rule is evaluated by the time
    // the target finishes building.
    std::string driver = cmStrCat(this->TargetDirectory, "/build");
    driver = cmSystemTools::ConvertToOutputPath(
      this->LocalGenerator->MaybeRelativeToTopBinDir(driver));
    makeDepends << driver << ": " << obj_m << ".provides.build\n";
  }

  return true;
}